

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XercesXPath::checkForSelectedAttributes(XercesXPath *this)

{
  BaseRefVectorOf<xercesc_4_0::XercesStep> *this_00;
  XercesLocationPath *pXVar1;
  XercesStep *pXVar2;
  XPathException *this_01;
  XMLSize_t XVar3;
  XMLSize_t getAt;
  XMLSize_t XVar4;
  
  if (this->fLocationPaths == (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0) {
    XVar4 = 0;
  }
  else {
    XVar4 = (this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fCurCount
    ;
  }
  if (XVar4 != 0) {
    getAt = 0;
    do {
      pXVar1 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                         (&this->fLocationPaths->
                           super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,getAt);
      this_00 = &pXVar1->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>;
      if (this_00 == (BaseRefVectorOf<xercesc_4_0::XercesStep> *)0x0) {
        XVar3 = 0;
      }
      else {
        XVar3 = this_00->fCurCount;
      }
      if (XVar3 != 0) {
        pXVar2 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt(this_00,XVar3 - 1);
        if (pXVar2->fAxisType == 2) {
          this_01 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x178,XPath_NoAttrSelector,this->fMemoryManager);
          __cxa_throw(this_01,&XPathException::typeinfo,XMLException::~XMLException);
        }
      }
      getAt = getAt + 1;
    } while (XVar4 != getAt);
  }
  return;
}

Assistant:

void XercesXPath::checkForSelectedAttributes() {

    // verify that an attribute is not selected
    XMLSize_t locSize = (fLocationPaths) ? fLocationPaths->size() : 0;

    for (XMLSize_t i = 0; i < locSize; i++) {

        XercesLocationPath* locPath = fLocationPaths->elementAt(i);
        XMLSize_t stepSize = locPath->getStepSize();

        if (stepSize) {
            if (locPath->getStep(stepSize - 1)->getAxisType() == XercesStep::AxisType_ATTRIBUTE) {
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoAttrSelector, fMemoryManager);
            }
		}
    }
}